

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O1

bool __thiscall SQGenerator::Resume(SQGenerator *this,SQVM *v,SQObjectPtr *dest)

{
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  SQInstruction **ppSVar3;
  SQInteger *pSVar4;
  SQObjectType SVar5;
  SQObjectType SVar6;
  uint uVar7;
  uint uVar8;
  SQUnsignedInteger SVar9;
  CallInfo *pCVar10;
  SQTable *pSVar11;
  SQExceptionTrap *pSVar12;
  SQUnsignedInteger SVar13;
  ulong uVar14;
  SQObjectPtr *pSVar15;
  SQWeakRef *pSVar16;
  SQObjectPtr *pSVar17;
  long lVar18;
  long *plVar19;
  SQInteger SVar20;
  SQInteger SVar21;
  SQInteger SVar22;
  bool bVar23;
  SQExceptionTrap *pSVar24;
  char *s;
  ulong uVar25;
  long lVar26;
  long lVar27;
  SQUnsignedInteger SVar28;
  
  if (this->_state == eRunning) {
    s = "resuming active generator";
  }
  else {
    if (this->_state != eDead) {
      uVar25 = (long)dest - (long)((v->_stack)._vals + v->_stackbase) >> 4;
      if (0xff < uVar25) {
        __assert_fail("target>=0 && target<=255",
                      "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/deps/squirrel/squirrel/sqobject.cpp"
                      ,0xab,"bool SQGenerator::Resume(SQVM *, SQObjectPtr &)");
      }
      SVar9 = (this->_stack)._size;
      lVar27 = v->_top;
      bVar23 = SQVM::EnterFrame(v,lVar27,lVar27 + SVar9,false);
      if (!bVar23) {
        return bVar23;
      }
      pCVar10 = v->ci;
      pCVar10->_generator = this;
      pCVar10->_target = (SQInt32)uVar25;
      SVar5 = (pCVar10->_closure).super_SQObject._type;
      pSVar11 = (pCVar10->_closure).super_SQObject._unVal.pTable;
      (pCVar10->_closure).super_SQObject._unVal = (this->_ci)._closure.super_SQObject._unVal;
      SVar6 = (this->_ci)._closure.super_SQObject._type;
      (pCVar10->_closure).super_SQObject._type = SVar6;
      if ((SVar6 >> 0x1b & 1) != 0) {
        pSVar1 = &(((pCVar10->_closure).super_SQObject._unVal.pTable)->super_SQDelegable).
                  super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      if ((SVar5 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar11->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar11->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
            [2])();
        }
      }
      pCVar10 = v->ci;
      pCVar10->_ip = (this->_ci)._ip;
      pCVar10->_literals = (this->_ci)._literals;
      pCVar10->_ncalls = (this->_ci)._ncalls;
      pCVar10->_etraps = (this->_ci)._etraps;
      pCVar10->_root = (this->_ci)._root;
      if (0 < (this->_ci)._etraps) {
        lVar26 = 0;
        do {
          pSVar12 = (this->_etraps)._vals;
          SVar13 = (this->_etraps)._size;
          uVar25 = (v->_etraps)._size;
          uVar14 = (v->_etraps)._allocated;
          if (uVar14 <= uVar25) {
            SVar28 = uVar25 * 2;
            if (SVar28 == 0) {
              SVar28 = 4;
            }
            pSVar24 = (SQExceptionTrap *)sq_vm_realloc((v->_etraps)._vals,uVar14 << 5,SVar28 << 5);
            (v->_etraps)._vals = pSVar24;
            (v->_etraps)._allocated = SVar28;
          }
          pSVar24 = (v->_etraps)._vals;
          SVar28 = (v->_etraps)._size;
          (v->_etraps)._size = SVar28 + 1;
          SVar20 = pSVar12[SVar13 - 1]._stackbase;
          SVar21 = pSVar12[SVar13 - 1]._stacksize;
          SVar22 = pSVar12[SVar13 - 1]._extarget;
          ppSVar3 = &pSVar24[SVar28]._ip;
          *ppSVar3 = pSVar12[SVar13 - 1]._ip;
          ppSVar3[1] = (SQInstruction *)SVar22;
          pSVar24 = pSVar24 + SVar28;
          pSVar24->_stackbase = SVar20;
          pSVar24->_stacksize = SVar21;
          pSVar1 = &(this->_etraps)._size;
          *pSVar1 = *pSVar1 - 1;
          pSVar24 = (v->_etraps)._vals;
          SVar13 = (v->_etraps)._size;
          pSVar12 = pSVar24 + (SVar13 - 1);
          pSVar12->_stackbase = pSVar12->_stackbase + lVar27;
          pSVar4 = &pSVar24[SVar13 - 1]._stacksize;
          *pSVar4 = *pSVar4 + lVar27;
          lVar26 = lVar26 + 1;
        } while (lVar26 < (this->_ci)._etraps);
      }
      pSVar15 = (this->_stack)._vals;
      SVar5 = (pSVar15->super_SQObject)._type;
      pSVar16 = (pSVar15->super_SQObject)._unVal.pWeakRef;
      pSVar17 = (v->_stack)._vals;
      lVar27 = v->_stackbase;
      pSVar15 = pSVar17 + lVar27;
      pSVar11 = pSVar17[lVar27].super_SQObject._unVal.pTable;
      if (SVar5 == OT_WEAKREF) {
        (pSVar15->super_SQObject)._unVal = (pSVar16->_obj)._unVal;
        SVar5 = (pSVar16->_obj)._type;
      }
      else {
        (pSVar15->super_SQObject)._unVal.pWeakRef = pSVar16;
      }
      SVar6 = pSVar17[lVar27].super_SQObject._type;
      (pSVar15->super_SQObject)._type = SVar5;
      if ((SVar5 >> 0x1b & 1) != 0) {
        pSVar1 = &(((pSVar15->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable
                  .super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      if ((SVar6 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar11->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar11->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
            [2])();
        }
      }
      if (1 < (long)SVar9) {
        lVar27 = SVar9 - 1;
        lVar26 = 0x18;
        do {
          lVar18 = v->_stackbase;
          pSVar15 = (v->_stack)._vals;
          pSVar17 = (this->_stack)._vals;
          uVar7 = *(uint *)((long)pSVar15 + lVar26 + -8 + lVar18 * 0x10);
          plVar19 = *(long **)((long)&pSVar15[lVar18].super_SQObject._type + lVar26);
          *(undefined8 *)((long)&pSVar15[lVar18].super_SQObject._type + lVar26) =
               *(undefined8 *)((long)&(pSVar17->super_SQObject)._type + lVar26);
          uVar8 = *(uint *)((long)pSVar17 + lVar26 + -8);
          *(uint *)((long)pSVar15 + lVar26 + -8 + lVar18 * 0x10) = uVar8;
          if ((uVar8 >> 0x1b & 1) != 0) {
            plVar2 = (long *)(*(long *)((long)&pSVar15[lVar18].super_SQObject._type + lVar26) + 8);
            *plVar2 = *plVar2 + 1;
          }
          if ((uVar7 >> 0x1b & 1) != 0) {
            plVar2 = plVar19 + 1;
            *plVar2 = *plVar2 + -1;
            if (*plVar2 == 0) {
              (**(code **)(*plVar19 + 0x10))();
            }
          }
          pSVar15 = (this->_stack)._vals;
          plVar19 = *(long **)((long)&(pSVar15->super_SQObject)._type + lVar26);
          uVar7 = *(uint *)((long)pSVar15 + lVar26 + -8);
          *(undefined4 *)((long)pSVar15 + lVar26 + -8) = 0x1000001;
          *(undefined8 *)((long)&(pSVar15->super_SQObject)._type + lVar26) = 0;
          if ((uVar7 >> 0x1b & 1) != 0) {
            plVar2 = plVar19 + 1;
            *plVar2 = *plVar2 + -1;
            if (*plVar2 == 0) {
              (**(code **)(*plVar19 + 0x10))();
            }
          }
          lVar26 = lVar26 + 0x10;
          lVar27 = lVar27 + -1;
        } while (lVar27 != 0);
      }
      this->_state = eRunning;
      if (v->_debughook == false) {
        return bVar23;
      }
      SQVM::CallDebugHook(v,99,0);
      return bVar23;
    }
    s = "resuming dead generator";
  }
  SQVM::Raise_Error(v,s);
  return false;
}

Assistant:

bool SQGenerator::Resume(SQVM *v,SQObjectPtr &dest)
{
    if(_state==eDead){ v->Raise_Error(_SC("resuming dead generator")); return false; }
    if(_state==eRunning){ v->Raise_Error(_SC("resuming active generator")); return false; }
    SQInteger size = _stack.size();
    SQInteger target = &dest - &(v->_stack._vals[v->_stackbase]);
    assert(target>=0 && target<=255);
    SQInteger newbase = v->_top;
    if(!v->EnterFrame(v->_top, v->_top + size, false))
        return false;
    v->ci->_generator   = this;
    v->ci->_target      = (SQInt32)target;
    v->ci->_closure     = _ci._closure;
    v->ci->_ip          = _ci._ip;
    v->ci->_literals    = _ci._literals;
    v->ci->_ncalls      = _ci._ncalls;
    v->ci->_etraps      = _ci._etraps;
    v->ci->_root        = _ci._root;


    for(SQInteger i=0;i<_ci._etraps;i++) {
        v->_etraps.push_back(_etraps.top());
        _etraps.pop_back();
        SQExceptionTrap &et = v->_etraps.back();
        // restore absolute stack base and size
        et._stackbase += newbase;
        et._stacksize += newbase;
    }
    SQObject _this = _stack._vals[0];
    v->_stack[v->_stackbase] = sq_type(_this) == OT_WEAKREF ? _weakref(_this)->_obj : _this;

    for(SQInteger n = 1; n<size; n++) {
        v->_stack[v->_stackbase+n] = _stack._vals[n];
        _stack._vals[n].Null();
    }

    _state=eRunning;
    if (v->_debughook)
        v->CallDebugHook(_SC('c'));

    return true;
}